

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statement.cpp
# Opt level: O0

void __thiscall SQLite::Statement::Statement(Statement *this,Database *aDatabase,char *apQuery)

{
  int iVar1;
  sqlite3 *psVar2;
  element_type *pStmt;
  allocator local_21;
  char *local_20;
  char *apQuery_local;
  Database *aDatabase_local;
  Statement *this_local;
  
  local_20 = apQuery;
  apQuery_local = (char *)aDatabase;
  aDatabase_local = (Database *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)this,apQuery,&local_21);
  std::allocator<char>::~allocator((allocator<char> *)&local_21);
  psVar2 = Database::getHandle((Database *)apQuery_local);
  this->mpSQLite = psVar2;
  prepareStatement((Statement *)&this->mpPreparedStatement);
  this->mColumnCount = 0;
  this->mbHasRow = false;
  this->mbDone = false;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::map(&this->mColumnNames);
  pStmt = std::__shared_ptr<sqlite3_stmt,_(__gnu_cxx::_Lock_policy)2>::get
                    (&(this->mpPreparedStatement).
                      super___shared_ptr<sqlite3_stmt,_(__gnu_cxx::_Lock_policy)2>);
  iVar1 = sqlite3_column_count(pStmt);
  this->mColumnCount = iVar1;
  return;
}

Assistant:

Statement::Statement(const Database& aDatabase, const char* apQuery) :
    mQuery(apQuery),
    mpSQLite(aDatabase.getHandle()),
    mpPreparedStatement(prepareStatement()) // prepare the SQL query (needs Database friendship)
{
    mColumnCount = sqlite3_column_count(mpPreparedStatement.get());
}